

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int source_set_outcomes(SOURCE_HANDLE source,AMQP_VALUE outcomes_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  
  if (source == (SOURCE_HANDLE)0x0) {
    iVar2 = 0x33d4;
  }
  else {
    if (outcomes_value == (AMQP_VALUE)0x0) {
      item_value = (AMQP_VALUE)0x0;
    }
    else {
      item_value = amqpvalue_clone(outcomes_value);
    }
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x33e4;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(source->composite_value,9,item_value);
      iVar2 = 0x33ea;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int source_set_outcomes(SOURCE_HANDLE source, AMQP_VALUE outcomes_value)
{
    int result;

    if (source == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        SOURCE_INSTANCE* source_instance = (SOURCE_INSTANCE*)source;
        AMQP_VALUE outcomes_amqp_value;
        if (outcomes_value == NULL)
        {
            outcomes_amqp_value = NULL;
        }
        else
        {
            outcomes_amqp_value = amqpvalue_clone(outcomes_value);
        }
        if (outcomes_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(source_instance->composite_value, 9, outcomes_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(outcomes_amqp_value);
        }
    }

    return result;
}